

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinition.cpp
# Opt level: O1

void __thiscall Shell::FunctionDefinition::assignArgOccursData(FunctionDefinition *this,Def *updDef)

{
  TermList **ppTVar1;
  TermList **ppTVar2;
  TermList **ppTVar3;
  int iVar4;
  bool *pbVar5;
  Entry *pEVar6;
  Entry *pEVar7;
  uint uVar8;
  anon_union_8_2_f154dc0f_for_Term_10 aVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  Def *pDVar13;
  anon_union_8_2_f154dc0f_for_Term_10 *paVar14;
  Term *trm;
  TermList *pTVar15;
  Term *pTVar16;
  uint local_40;
  uint local_3c;
  FunctionDefinition *local_38;
  
  uVar10 = *(uint *)&updDef->lhs->field_0xc;
  if ((uVar10 & 0xfffffff) != 0) {
    uVar10 = (uVar10 & 0xfffffff) + 0xf & 0xfffffff0;
    local_38 = this;
    if (uVar10 == 0) {
      pbVar5 = (bool *)::Lib::FixedSizeAllocator<8UL>::alloc
                                 ((FixedSizeAllocator<8UL> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar10 < 0x11) {
      pbVar5 = (bool *)::Lib::FixedSizeAllocator<16UL>::alloc
                                 ((FixedSizeAllocator<16UL> *)
                                  (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar10 < 0x19) {
      pbVar5 = (bool *)::Lib::FixedSizeAllocator<24UL>::alloc
                                 ((FixedSizeAllocator<24UL> *)
                                  (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar10 < 0x21) {
      pbVar5 = (bool *)::Lib::FixedSizeAllocator<32UL>::alloc
                                 ((FixedSizeAllocator<32UL> *)
                                  (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar10 < 0x31) {
      pbVar5 = (bool *)::Lib::FixedSizeAllocator<48UL>::alloc
                                 ((FixedSizeAllocator<48UL> *)
                                  (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar10 < 0x41) {
      pbVar5 = (bool *)::Lib::FixedSizeAllocator<64UL>::alloc
                                 ((FixedSizeAllocator<64UL> *)
                                  (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      pbVar5 = (bool *)::operator_new((ulong)uVar10,0x10);
    }
    updDef->argOccurs = pbVar5;
    memset(pbVar5,0,(ulong)(*(uint *)&updDef->lhs->field_0xc & 0xfffffff));
    if (assignArgOccursData(Shell::FunctionDefinition::Def*)::var2argIndex == '\0') {
      assignArgOccursData();
    }
    ::Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::reset
              (&assignArgOccursData::var2argIndex);
    pTVar16 = updDef->lhs;
    uVar10 = *(uint *)&pTVar16->field_0xc & 0xfffffff;
    aVar9 = *(anon_union_8_2_f154dc0f_for_Term_10 *)(pTVar16->_args + uVar10);
    if ((aVar9._vars & 3) != 2) {
      paVar14 = (anon_union_8_2_f154dc0f_for_Term_10 *)(pTVar16->_args + ((ulong)uVar10 - 1));
      uVar10 = 0;
      do {
        ::Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::insert
                  (&assignArgOccursData::var2argIndex,(uint)((ulong)aVar9 >> 2),uVar10);
        uVar10 = uVar10 + 1;
        aVar9 = *paVar14;
        paVar14 = paVar14 + -1;
      } while ((aVar9._vars & 3) != 2);
    }
    pTVar16 = updDef->rhs;
    if ((assignArgOccursData(Shell::FunctionDefinition::Def*)::stack == '\0') &&
       (iVar4 = __cxa_guard_acquire(&assignArgOccursData(Shell::FunctionDefinition::Def*)::stack),
       iVar4 != 0)) {
      assignArgOccursData::stack._capacity = 4;
      assignArgOccursData::stack._stack =
           (TermList **)
           ::Lib::FixedSizeAllocator<32UL>::alloc
                     ((FixedSizeAllocator<32UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
      assignArgOccursData::stack._end =
           assignArgOccursData::stack._stack + assignArgOccursData::stack._capacity;
      assignArgOccursData::stack._cursor = assignArgOccursData::stack._stack;
      __cxa_atexit(::Lib::Stack<Kernel::TermList_*>::~Stack,&assignArgOccursData::stack,
                   &__dso_handle);
      __cxa_guard_release(&assignArgOccursData(Shell::FunctionDefinition::Def*)::stack);
    }
    if ((assignArgOccursData(Shell::FunctionDefinition::Def*)::defArgStack == '\0') &&
       (iVar4 = __cxa_guard_acquire(&assignArgOccursData(Shell::FunctionDefinition::Def*)::
                                     defArgStack), iVar4 != 0)) {
      assignArgOccursData::defArgStack._capacity = 4;
      assignArgOccursData::defArgStack._stack =
           (Def **)::Lib::FixedSizeAllocator<32UL>::alloc
                             ((FixedSizeAllocator<32UL> *)
                              (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
      assignArgOccursData::defArgStack._end =
           assignArgOccursData::defArgStack._stack + assignArgOccursData::defArgStack._capacity;
      assignArgOccursData::defArgStack._cursor = assignArgOccursData::defArgStack._stack;
      __cxa_atexit(::Lib::Stack<Shell::FunctionDefinition::Def_*>::~Stack,
                   &assignArgOccursData::defArgStack,&__dso_handle);
      __cxa_guard_release(&assignArgOccursData(Shell::FunctionDefinition::Def*)::defArgStack);
    }
    if ((assignArgOccursData(Shell::FunctionDefinition::Def*)::termArgStack == '\0') &&
       (iVar4 = __cxa_guard_acquire(&assignArgOccursData(Shell::FunctionDefinition::Def*)::
                                     termArgStack), iVar4 != 0)) {
      assignArgOccursData::termArgStack._capacity = 4;
      assignArgOccursData::termArgStack._stack =
           (Term **)::Lib::FixedSizeAllocator<32UL>::alloc
                              ((FixedSizeAllocator<32UL> *)
                               (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
      assignArgOccursData::termArgStack._end =
           assignArgOccursData::termArgStack._stack + assignArgOccursData::termArgStack._capacity;
      assignArgOccursData::termArgStack._cursor = assignArgOccursData::termArgStack._stack;
      __cxa_atexit(::Lib::Stack<Kernel::Term_*>::~Stack,&assignArgOccursData::termArgStack,
                   &__dso_handle);
      __cxa_guard_release(&assignArgOccursData(Shell::FunctionDefinition::Def*)::termArgStack);
    }
    do {
      if (((ulong)pTVar16 & 3) == 0) {
        if ((*(uint *)&pTVar16->field_0xc & 0xfffffff) != 0) {
          if ((pTVar16->_args[0]._content & 0x20) == 0) {
            local_40 = pTVar16->_functor;
            pEVar6 = ::Lib::
                     DHMap<int,_Shell::FunctionDefinition::Def_*,_Lib::IdentityHash,_Lib::DefaultHash>
                     ::findEntry(&local_38->_defs,(int *)&local_40);
            if ((pEVar6 == (Entry *)0x0) || (pDVar13 = pEVar6->_val, pDVar13->mark == BLOCKED))
            goto LAB_006f846e;
          }
          else {
LAB_006f846e:
            pDVar13 = (Def *)0x0;
          }
          uVar10 = *(uint *)&pTVar16->field_0xc;
          if (assignArgOccursData::stack._cursor == assignArgOccursData::stack._end) {
            ::Lib::Stack<Kernel::TermList_*>::expand(&assignArgOccursData::stack);
          }
          *assignArgOccursData::stack._cursor = pTVar16->_args + (uVar10 & 0xfffffff);
          assignArgOccursData::stack._cursor = assignArgOccursData::stack._cursor + 1;
          if (assignArgOccursData::defArgStack._cursor == assignArgOccursData::defArgStack._end) {
            ::Lib::Stack<Shell::FunctionDefinition::Def_*>::expand
                      (&assignArgOccursData::defArgStack);
          }
          *assignArgOccursData::defArgStack._cursor = pDVar13;
          assignArgOccursData::defArgStack._cursor = assignArgOccursData::defArgStack._cursor + 1;
          if (assignArgOccursData::termArgStack._cursor == assignArgOccursData::termArgStack._end) {
            ::Lib::Stack<Kernel::Term_*>::expand(&assignArgOccursData::termArgStack);
          }
          *assignArgOccursData::termArgStack._cursor = pTVar16;
          assignArgOccursData::termArgStack._cursor = assignArgOccursData::termArgStack._cursor + 1;
        }
      }
      else if ((int)((ulong)pTVar16 & 3) == 2) {
        assignArgOccursData::defArgStack._cursor = assignArgOccursData::defArgStack._cursor + -1;
        assignArgOccursData::termArgStack._cursor = assignArgOccursData::termArgStack._cursor + -1;
      }
      else {
        pbVar5 = updDef->argOccurs;
        local_3c = (uint)((ulong)pTVar16 >> 2);
        pEVar7 = ::Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::
                 findEntry(&assignArgOccursData::var2argIndex,&local_3c);
        pbVar5[pEVar7->_val] = true;
      }
      ppTVar3 = assignArgOccursData::stack._cursor;
      ppTVar2 = assignArgOccursData::stack._stack;
      if (assignArgOccursData::stack._cursor != assignArgOccursData::stack._stack) {
        ppTVar1 = assignArgOccursData::stack._cursor + -1;
        pTVar15 = assignArgOccursData::stack._cursor[-1];
        assignArgOccursData::stack._cursor = ppTVar1;
        if ((pTVar15->_content & 3) != 2) {
          if (assignArgOccursData::defArgStack._cursor[-1] == (Def *)0x0) {
LAB_006f8603:
            if (ppTVar1 == assignArgOccursData::stack._end) {
              ::Lib::Stack<Kernel::TermList_*>::expand(&assignArgOccursData::stack);
            }
            *assignArgOccursData::stack._cursor = pTVar15 + -1;
            assignArgOccursData::stack._cursor = assignArgOccursData::stack._cursor + 1;
          }
          else {
            uVar10 = (uint)pTVar15->_content & 3;
            if (uVar10 != 2) {
              pTVar16 = assignArgOccursData::termArgStack._cursor[-1];
              pbVar5 = assignArgOccursData::defArgStack._cursor[-1]->argOccurs;
              uVar8 = *(uint *)&pTVar16->field_0xc & 0xfffffff;
              if (pbVar5[uVar8 - (int)((ulong)((long)pTVar15 + (-0x28 - (long)pTVar16)) >> 3)] ==
                  false) {
                uVar11 = (long)pTVar15 + (-0x30 - (long)pTVar16);
                do {
                  pTVar15 = pTVar15 + -1;
                  uVar10 = (uint)pTVar15->_content & 3;
                  if (uVar10 == 2) goto LAB_006f8633;
                  uVar12 = uVar11 >> 3;
                  uVar11 = uVar11 - 8;
                } while (pbVar5[uVar8 - (int)uVar12] == false);
              }
              if (uVar10 != 2) goto LAB_006f8603;
            }
          }
        }
LAB_006f8633:
        pTVar16 = (Term *)pTVar15->_content;
      }
    } while (ppTVar3 != ppTVar2);
  }
  return;
}

Assistant:

void FunctionDefinition::assignArgOccursData(Def* updDef)
{
  ASS(!updDef->argOccurs);

  if(!updDef->lhs->arity()) {
    return;
  }

  updDef->argOccurs=reinterpret_cast<bool*>(ALLOC_KNOWN(updDef->lhs->arity()*sizeof(bool),
	    "FunctionDefinition::Def::argOccurs"));
  std::memset(updDef->argOccurs, 0, updDef->lhs->arity() * sizeof(bool));

  static DHMap<unsigned, unsigned, IdentityHash, DefaultHash> var2argIndex;
  var2argIndex.reset();
  int argIndex=0;
  for (TermList* ts = updDef->lhs->args(); ts->isNonEmpty(); ts=ts->next()) {
    int w = ts->var();
    var2argIndex.insert(w, argIndex);
    argIndex++;
  }

  TermList t=TermList(updDef->rhs);
  static Stack<TermList*> stack(4);
  static Stack<Def*> defArgStack(4);
  static Stack<Term*> termArgStack(4);
  for(;;) {
    Def* d;
    if(t.isEmpty()) {
      defArgStack.pop();
      termArgStack.pop();
    } else if(t.isTerm()) {
      Term* trm=t.term();
      if(trm->arity()) {
        if(trm->isSort() || !_defs.find(trm->functor(), d) || d->mark==Def::BLOCKED) {
          d=0;
        }
        ASS(!d || d->mark==Def::SAFE);
        stack.push(trm->args());
        defArgStack.push(d);
        termArgStack.push(trm);
      }
    } else {
      ASS(t.isOrdinaryVar());
      updDef->argOccurs[var2argIndex.get(t.var())]=true;
    }
    if(stack.isEmpty()) {
      break;
    }
    TermList* ts=stack.pop();
    if(!ts->isEmpty()) {
      Def* argDef=defArgStack.top();
      if(argDef) {
        Term* parentTerm=termArgStack.top();
        while(ts->isNonEmpty() && !argDef->argOccurs[parentTerm->getArgumentIndex(ts)]) {
          ts=ts->next();
        }
        if(ts->isNonEmpty()) {
          stack.push(ts->next());
        }
      } else {
        stack.push(ts->next());
      }
    }
    t=*ts;
  }
}